

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncResult.h
# Opt level: O0

optional<int> __thiscall
nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
          (Impl *this,duration<long,_std::ratio<1L,_1000L>_> *timeout)

{
  bool bVar1;
  undefined8 in_RDX;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  duration<long,_std::ratio<1L,_1000L>_> *timeout_local;
  Impl *this_local;
  
  lock._8_8_ = in_RDX;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_30,(mutex_type *)timeout);
  bVar1 = std::experimental::fundamentals_v1::optional::operator_cast_to_bool
                    ((optional *)(timeout + 0xb));
  if (bVar1) {
    std::experimental::fundamentals_v1::optional<int>::optional
              ((optional<int> *)this,(optional<int> *)(timeout + 0xb));
  }
  else {
    std::condition_variable::
    wait_for<long,std::ratio<1l,1000l>,nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>(std::chrono::duration<long,std::ratio<1l,1000l>>const&)const::_lambda()_1_>
              ((condition_variable *)(timeout + 5),(unique_lock<std::mutex> *)local_30,
               (duration<long,_std::ratio<1L,_1000L>_> *)lock._8_8_,(anon_class_8_1_8991fb9c)timeout
              );
    std::experimental::fundamentals_v1::optional<int>::optional
              ((optional<int> *)this,(optional<int> *)(timeout + 0xb));
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return (optional<int>)(_Optional_base<int,_false>)this;
}

Assistant:

std::experimental::optional<R> getResult(const std::chrono::duration<Rep, Period>& timeout) const
        {
            std::unique_lock<std::mutex> lock(guard_);
            if (result_) {
                return result_;
            }

            cond_.wait_for(lock, timeout, [this]() { return static_cast<bool>(result_); });
            return result_;
        }